

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::EnsureLongBranch(ByteCodeWriter *this,OpCode op)

{
  code *pcVar1;
  anon_class_32_4_69e2f02f map;
  bool bVar2;
  uint firstUnknownJumpInfo;
  undefined4 *puVar3;
  bool local_51;
  undefined7 uStack_2f;
  int local_20;
  bool foundUnknown;
  ByteCodeLabel branchAroundLabel;
  OpCode OStack_12;
  bool needBranchAround;
  int currentOffset;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  OStack_12 = op;
  _currentOffset = this;
  if ((this->useBranchIsland & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xb08,"(useBranchIsland)","useBranchIsland");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  branchAroundLabel = Data::GetCurrentOffset(&this->m_byteCodeData);
  if ((branchAroundLabel < this->nextBranchIslandOffset) || ((this->inEnsureLongBranch & 1U) != 0))
  {
    this->lastOpcode = OStack_12;
  }
  else {
    bVar2 = OpCodeAttr::HasFallThrough(this->lastOpcode);
    local_51 = true;
    if (!bVar2) {
      local_51 = this->lastOpcode == Leave;
    }
    foundUnknown = local_51;
    this->lastOpcode = OStack_12;
    if ((((local_51 == false) || (bVar2 = OpCodeAttr::HasFallThrough(OStack_12), bVar2)) ||
        (OStack_12 == StatementBoundary)) || (OStack_12 == Label)) {
      local_20 = -1;
      map.currentOffset = &branchAroundLabel;
      map.branchAroundLabel = &local_20;
      map.this = this;
      map._24_8_ = CONCAT71(uStack_2f,foundUnknown) & 0xffffffffffffff01;
      bVar2 = JsUtil::
              List<Js::ByteCodeWriter::JumpInfo,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              ::MapUntilFrom<Js::ByteCodeWriter::EnsureLongBranch(Js::OpCode)::__0>
                        ((List<Js::ByteCodeWriter::JumpInfo,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                          *)this->m_jumpOffsets,this->firstUnknownJumpInfo,map);
      if (!bVar2) {
        firstUnknownJumpInfo =
             JsUtil::
             ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>::
             Count(&this->m_jumpOffsets->
                    super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                  );
        UpdateNextBranchIslandOffset(this,firstUnknownJumpInfo,branchAroundLabel);
      }
      if (local_20 != -1) {
        MarkLabel(this,local_20);
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::EnsureLongBranch(Js::OpCode op)
    {
        Assert(useBranchIsland);
        int currentOffset = this->m_byteCodeData.GetCurrentOffset();

        // See if we need to emit branch island yet, and avoid recursion.
        if (currentOffset < this->nextBranchIslandOffset || this->inEnsureLongBranch)
        {
            lastOpcode = op;
            return;
        }

        // Leave actually may continue right after, it is only no fall through in the JIT.
        bool needBranchAround = OpCodeAttr::HasFallThrough(lastOpcode) || lastOpcode == Js::OpCode::Leave;
        lastOpcode = op;

        // If we are about to emit a no fall through op and the last was has fall through
        // then just emit the no fall through op, and then we can skip the branch around.
        // Except at label or StatementBoundary, we always want to emit before them.
        if ((needBranchAround && !OpCodeAttr::HasFallThrough(op))
            && op != Js::OpCode::StatementBoundary && op != Js::OpCode::Label)
        {
            return;
        }

        ByteCodeLabel branchAroundLabel = (Js::ByteCodeLabel)-1;
        bool foundUnknown = m_jumpOffsets->MapUntilFrom(firstUnknownJumpInfo,
            [=, &branchAroundLabel, &currentOffset](int index, JumpInfo& jumpInfo)
        {
            //
            // Read "labelID" stored at the offset within the byte-code.
            //
            uint jumpByteOffset = jumpInfo.patchOffset;
            AssertMsg(jumpByteOffset <= this->m_byteCodeData.GetCurrentOffset() - sizeof(JumpOffset),
                "Must have valid jump site within byte-code to back-patch");

            ByteCodeLabel labelID = jumpInfo.labelId;
            CheckLabel(labelID);

            // See if the label has bee marked yet.
            uint const labelByteOffset = m_labelOffsets->Item(labelID);
            if (labelByteOffset != UINT_MAX)
            {
                // If a label is already defined, then it should be short
                // (otherwise we should have emitted a branch island for it already).
                Assert((int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit()
                    && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit());
                return false;
            }

            this->UpdateNextBranchIslandOffset(index, jumpByteOffset);
            // Flush all the jump that are half of the way to the limit as well so we don't have
            // as many jump around of branch island.
            int flushNextBranchIslandOffset = this->nextBranchIslandOffset - GetBranchLimit() / 2;
            if (currentOffset < flushNextBranchIslandOffset)
            {
                // No need to for long branch yet. Terminate the loop.
                return true;
            }

            if (labelID == branchAroundLabel)
            {
                // Let's not flush the branchAroundLabel.
                // Should happen very rarely and mostly when the branch limit is very small.

                // This should be the last short jump we have just emitted (below).
                Assert(index == m_jumpOffsets->Count() - 1);
                Assert(currentOffset < this->nextBranchIslandOffset);
                return true;
            }

            // Emit long branch

            // Prevent recursion when we emit byte code here
            this->inEnsureLongBranch = true;

            // Create the branch label and update the jumpInfo.
            // Need to update the jumpInfo before we add the branch island as that might resize the m_jumpOffsets list.
            ByteCodeLabel longBranchLabel = this->DefineLabel();
            jumpInfo.labelId = longBranchLabel;

            // Emit the branch around if it hasn't been emitted already
            if (branchAroundLabel == (Js::ByteCodeLabel)-1 && needBranchAround)
            {
                branchAroundLabel = this->DefineLabel();
                this->Br(Js::OpCode::Br, branchAroundLabel);

                Assert(this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize);
                currentOffset += JumpAroundSize;

                // Continue to count he jumpAroundSize, because we may have to emit
                // yet another branch island right after if the jumpAroundSize is included.
            }

            // Emit the long branch
            this->MarkLabel(longBranchLabel);
            this->BrLong(Js::OpCode::BrLong, labelID);

            this->inEnsureLongBranch = false;

            Assert(this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize);
            currentOffset += LongBranchSize;
            return false;
        });

        if (!foundUnknown)
        {
            // Nothing is found, just set the next branch island from the current offset
            this->UpdateNextBranchIslandOffset(this->m_jumpOffsets->Count(), currentOffset);
        }

        if (branchAroundLabel != (Js::ByteCodeLabel)-1)
        {
            // Make the branch around label if we needed one
            this->MarkLabel(branchAroundLabel);
        }
    }